

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_compare_firstGreaterThanSecond_fn(int _i)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_120;
  char *pcStack_118;
  char *pcStack_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined8 uStack_f0;
  AString string4;
  AString string3;
  AString string2;
  AString string1;
  
  string1.reallocator._0_4_ = 0x11e238;
  string1.reallocator._4_4_ = 0;
  string1.deallocator._0_4_ = 0x11e278;
  string1.deallocator._4_4_ = 0;
  string1.buffer = (char *)0x0;
  string1.size = 0;
  string1.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x1497c0;
  string1.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  *string1.buffer = '\0';
  string2.buffer = (char *)0x0;
  string2.reallocator._0_4_ = 0x11e238;
  string2.reallocator._4_4_ = 0;
  string2.deallocator._0_4_ = 0x11e278;
  string2.deallocator._4_4_ = 0;
  string2.size = 1;
  string2.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x149820;
  string2.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string2.buffer[0] = 'a';
  string2.buffer[1] = '\0';
  string3.buffer = (char *)0x0;
  string3.reallocator._0_4_ = 0x11e238;
  string3.reallocator._4_4_ = 0;
  string3.deallocator._0_4_ = 0x11e278;
  string3.deallocator._4_4_ = 0;
  string3.size = 1;
  string3.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x149882;
  string3.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string3.buffer[0] = 'b';
  string3.buffer[1] = '\0';
  string4.buffer = (char *)0x0;
  string4.reallocator._0_4_ = 0x11e238;
  string4.reallocator._4_4_ = 0;
  string4.deallocator._0_4_ = 0x11e278;
  string4.deallocator._4_4_ = 0;
  string4.size = 2;
  string4.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x1498dc;
  string4.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string4.buffer[2] = '\0';
  string4.buffer[0] = 'b';
  string4.buffer[1] = 'a';
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x149911;
  iVar1 = AString_compare(&string2,&string1);
  if (iVar1 < 1) {
    local_108 = (char *)(long)iVar1;
    ppcVar6 = &local_108;
    local_100 = "0";
    pcVar4 = "Assertion \'_ck_x > _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar7 = "AString_compare(&string2, &string1) > 0";
    pcVar8 = "AString_compare(&string2, &string1)";
    iVar1 = 0x8ef;
    goto LAB_0014a970;
  }
  uStack_f0 = 0x14992a;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8ef);
  if (string1.capacity != 8) {
    pcVar4 = "(string1).capacity == (8)";
    pcVar7 = "(string1).capacity";
    iVar1 = 0x8f0;
    pcVar3 = (char *)string1.capacity;
    goto LAB_0014a84a;
  }
  uStack_f0 = 0x14994d;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8f0);
  if (string1.buffer == (char *)0x0) {
    ppcVar6 = &local_f8;
    pcVar4 = "Assertion \'_ck_x != NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (string1).buffer != NULL";
    pcVar8 = "(void*) (string1).buffer";
LAB_0014a06b:
    iVar1 = 0x8f0;
LAB_0014a970:
    uStack_f0 = 0;
    local_f8 = (char *)0x0;
    *(code **)((long)ppcVar6 + -8) = test_AString_compare_nullptr_fn;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar1,pcVar4,pcVar3,pcVar7,pcVar8);
  }
  uStack_f0 = 0x14996d;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8f0);
  if (string1.buffer == (char *)0x0) {
    pcStack_120 = "(null)";
    pcStack_118 = "";
LAB_00149fe1:
    uStack_f0 = 0;
    local_f8 = "\"";
    local_100 = "";
    local_108 = "\"";
    pcStack_110 = "(\"\")";
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f0,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "(string1).buffer == (\"\")","(string1).buffer",pcStack_118);
  }
  if (*string1.buffer != '\0') {
    pcStack_118 = "\"";
    pcStack_120 = string1.buffer;
    goto LAB_00149fe1;
  }
  uStack_f0 = 0x1499a0;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8f0);
  if (string1.size != 0) {
    ppcVar6 = &local_108;
    local_100 = "strlen(\"\")";
    local_108 = (char *)string1.size;
    pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar7 = "(string1).size == strlen(\"\")";
    pcVar8 = "(string1).size";
    goto LAB_0014a06b;
  }
  uStack_f0 = 0x1499c2;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8f0);
  if (string2.capacity != 8) {
    pcVar4 = "(string2).capacity == (8)";
    pcVar7 = "(string2).capacity";
    iVar1 = 0x8f1;
    pcVar3 = (char *)string2.capacity;
    goto LAB_0014a84a;
  }
  uStack_f0 = 0x1499e2;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8f1);
  if (string2.buffer == (char *)0x0) {
    ppcVar6 = &local_f8;
    pcVar4 = "Assertion \'_ck_x != NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (string2).buffer != NULL";
    pcVar8 = "(void*) (string2).buffer";
    iVar1 = 0x8f1;
    goto LAB_0014a970;
  }
  uStack_f0 = 0x149a02;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8f1);
  pcVar8 = string2.buffer;
  if (string2.buffer == (char *)0x0) {
    pcVar3 = "";
    pcVar8 = "(null)";
  }
  else {
    uStack_f0 = 0x149a25;
    iVar1 = strcmp("a",string2.buffer);
    if (iVar1 == 0) {
      uStack_f0 = 0x149a3e;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f1);
      if (string2.size != 1) {
        local_100 = "strlen(\"a\")";
        pcVar4 = "(string2).size == strlen(\"a\")";
        pcVar7 = "(string2).size";
        iVar1 = 0x8f1;
        pcVar3 = (char *)string2.size;
        goto LAB_0014a813;
      }
      uStack_f0 = 0x149a5e;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f1);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        ppcVar6 = &local_108;
        local_100 = "(0)";
        local_108 = (char *)private_ACUtilsTest_AString_reallocCount;
        pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
        pcVar8 = "private_ACUtilsTest_AString_reallocCount";
        iVar1 = 0x8f2;
        goto LAB_0014a970;
      }
      uStack_f0 = 0x149a7f;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f2);
      uStack_f0 = 0x149a8e;
      iVar1 = AString_compare(&string3,&string2);
      if (iVar1 < 1) {
        local_108 = (char *)(long)iVar1;
        ppcVar6 = &local_108;
        local_100 = "0";
        pcVar4 = "Assertion \'_ck_x > _ck_y\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar7 = "AString_compare(&string3, &string2) > 0";
        pcVar8 = "AString_compare(&string3, &string2)";
        iVar1 = 0x8f3;
        goto LAB_0014a970;
      }
      uStack_f0 = 0x149aa7;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f3);
      if (string2.capacity != 8) {
        pcVar4 = "(string2).capacity == (8)";
        pcVar7 = "(string2).capacity";
        iVar1 = 0x8f4;
        pcVar3 = (char *)string2.capacity;
        goto LAB_0014a84a;
      }
      uStack_f0 = 0x149ac7;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f4);
      if (string2.buffer == (char *)0x0) {
        ppcVar6 = &local_f8;
        pcVar4 = "Assertion \'_ck_x != NULL\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) (string2).buffer != NULL";
        pcVar8 = "(void*) (string2).buffer";
        iVar1 = 0x8f4;
        goto LAB_0014a970;
      }
      uStack_f0 = 0x149ae7;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f4);
      pcVar8 = string2.buffer;
      if (string2.buffer == (char *)0x0) {
        pcVar3 = "";
        pcVar8 = "(null)";
LAB_0014a294:
        pcStack_110 = "(\"a\")";
        pcVar4 = "(string2).buffer == (\"a\")";
        pcVar7 = "(string2).buffer";
        iVar1 = 0x8f4;
        local_100 = "a";
      }
      else {
        uStack_f0 = 0x149b0a;
        iVar1 = strcmp("a",string2.buffer);
        if (iVar1 != 0) {
          pcVar3 = "\"";
          goto LAB_0014a294;
        }
        uStack_f0 = 0x149b23;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x8f4);
        if (string2.size != 1) {
          local_100 = "strlen(\"a\")";
          pcVar4 = "(string2).size == strlen(\"a\")";
          pcVar7 = "(string2).size";
          iVar1 = 0x8f4;
          pcVar3 = (char *)string2.size;
LAB_0014a813:
          local_f8 = (char *)0x1;
LAB_0014a850:
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          ppcVar5 = &local_100;
          goto LAB_0014a852;
        }
        uStack_f0 = 0x149b43;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x8f4);
        if (string3.capacity != 8) {
          pcVar4 = "(string3).capacity == (8)";
          pcVar7 = "(string3).capacity";
          iVar1 = 0x8f5;
          pcVar3 = (char *)string3.capacity;
          goto LAB_0014a84a;
        }
        uStack_f0 = 0x149b63;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x8f5);
        if (string3.buffer == (char *)0x0) {
          ppcVar6 = &local_f8;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) (string3).buffer != NULL";
          pcVar8 = "(void*) (string3).buffer";
          iVar1 = 0x8f5;
          goto LAB_0014a970;
        }
        uStack_f0 = 0x149b80;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x8f5);
        pcVar8 = string3.buffer;
        if (string3.buffer == (char *)0x0) {
          pcVar3 = "";
          pcVar8 = "(null)";
LAB_0014a386:
          pcStack_110 = "(\"b\")";
          pcVar4 = "(string3).buffer == (\"b\")";
          pcVar7 = "(string3).buffer";
          iVar1 = 0x8f5;
          local_100 = "b";
        }
        else {
          uStack_f0 = 0x149ba0;
          iVar1 = strcmp("b",string3.buffer);
          if (iVar1 != 0) {
            pcVar3 = "\"";
            goto LAB_0014a386;
          }
          uStack_f0 = 0x149bb9;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f5);
          if (string3.size != 1) {
            local_100 = "strlen(\"b\")";
            pcVar4 = "(string3).size == strlen(\"b\")";
            pcVar7 = "(string3).size";
            iVar1 = 0x8f5;
            pcVar3 = (char *)string3.size;
            goto LAB_0014a813;
          }
          uStack_f0 = 0x149bd9;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f5);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            ppcVar6 = &local_108;
            local_100 = "(0)";
            local_108 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar8 = "private_ACUtilsTest_AString_reallocCount";
            iVar1 = 0x8f6;
            goto LAB_0014a970;
          }
          uStack_f0 = 0x149bfa;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f6);
          uStack_f0 = 0x149c07;
          iVar1 = AString_compare(&string4,&string2);
          if (iVar1 < 1) {
            local_108 = (char *)(long)iVar1;
            ppcVar6 = &local_108;
            local_100 = "0";
            pcVar4 = "Assertion \'_ck_x > _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar7 = "AString_compare(&string4, &string2) > 0";
            pcVar8 = "AString_compare(&string4, &string2)";
            iVar1 = 0x8f7;
            goto LAB_0014a970;
          }
          uStack_f0 = 0x149c20;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f7);
          if (string2.capacity != 8) {
            pcVar4 = "(string2).capacity == (8)";
            pcVar7 = "(string2).capacity";
            iVar1 = 0x8f8;
            pcVar3 = (char *)string2.capacity;
            goto LAB_0014a84a;
          }
          uStack_f0 = 0x149c40;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f8);
          if (string2.buffer == (char *)0x0) {
            ppcVar6 = &local_f8;
            pcVar4 = "Assertion \'_ck_x != NULL\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %#x";
            pcVar7 = "(void*) (string2).buffer != NULL";
            pcVar8 = "(void*) (string2).buffer";
            iVar1 = 0x8f8;
            goto LAB_0014a970;
          }
          uStack_f0 = 0x149c60;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f8);
          pcVar8 = string2.buffer;
          if (string2.buffer == (char *)0x0) {
            pcVar3 = "";
            pcVar8 = "(null)";
LAB_0014a513:
            pcVar4 = "(string2).buffer == (\"a\")";
            pcVar7 = "(string2).buffer";
            iVar1 = 0x8f8;
            local_100 = "a";
            pcStack_110 = "(\"a\")";
          }
          else {
            uStack_f0 = 0x149c80;
            iVar1 = strcmp("a",string2.buffer);
            if (iVar1 != 0) {
              pcVar3 = "\"";
              goto LAB_0014a513;
            }
            uStack_f0 = 0x149c99;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8f8);
            if (string2.size != 1) {
              local_100 = "strlen(\"a\")";
              pcVar4 = "(string2).size == strlen(\"a\")";
              pcVar7 = "(string2).size";
              iVar1 = 0x8f8;
              pcVar3 = (char *)string2.size;
              goto LAB_0014a813;
            }
            uStack_f0 = 0x149cb9;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8f8);
            if (string4.capacity != 8) {
              pcVar4 = "(string4).capacity == (8)";
              pcVar7 = "(string4).capacity";
              iVar1 = 0x8f9;
              pcVar3 = (char *)string4.capacity;
              goto LAB_0014a84a;
            }
            uStack_f0 = 0x149cd9;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8f9);
            if (string4.buffer == (char *)0x0) {
              ppcVar6 = &local_f8;
              pcVar4 = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar7 = "(void*) (string4).buffer != NULL";
              pcVar8 = "(void*) (string4).buffer";
              iVar1 = 0x8f9;
              goto LAB_0014a970;
            }
            uStack_f0 = 0x149cf6;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8f9);
            pcVar8 = string4.buffer;
            if (string4.buffer == (char *)0x0) {
              pcVar3 = "";
              pcVar8 = "(null)";
LAB_0014a610:
              pcStack_110 = "(\"ba\")";
              pcVar4 = "(string4).buffer == (\"ba\")";
              pcVar7 = "(string4).buffer";
              iVar1 = 0x8f9;
              local_100 = "ba";
            }
            else {
              uStack_f0 = 0x149d16;
              iVar1 = strcmp("ba",string4.buffer);
              if (iVar1 != 0) {
                pcVar3 = "\"";
                goto LAB_0014a610;
              }
              uStack_f0 = 0x149d2f;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f9);
              if (string4.size != 2) {
                iVar1 = 0x8f9;
LAB_0014a921:
                local_100 = "strlen(\"ba\")";
                pcVar7 = "(string4).size";
                pcVar4 = "(string4).size == strlen(\"ba\")";
                local_f8 = (char *)0x2;
                pcVar3 = (char *)string4.size;
                goto LAB_0014a850;
              }
              uStack_f0 = 0x149d4f;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f9);
              if (private_ACUtilsTest_AString_reallocCount != 0) {
                ppcVar6 = &local_108;
                local_100 = "(0)";
                local_108 = (char *)private_ACUtilsTest_AString_reallocCount;
                pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
                pcVar8 = "private_ACUtilsTest_AString_reallocCount";
                iVar1 = 0x8fa;
                goto LAB_0014a970;
              }
              uStack_f0 = 0x149d70;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8fa);
              uStack_f0 = 0x149d7d;
              iVar1 = AString_compare(&string4,&string3);
              if (iVar1 < 1) {
                local_108 = (char *)(long)iVar1;
                ppcVar6 = &local_108;
                local_100 = "0";
                pcVar4 = "Assertion \'_ck_x > _ck_y\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
                pcVar7 = "AString_compare(&string4, &string3) > 0";
                pcVar8 = "AString_compare(&string4, &string3)";
                iVar1 = 0x8fb;
                goto LAB_0014a970;
              }
              uStack_f0 = 0x149d96;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8fb);
              if (string3.capacity != 8) {
                pcVar4 = "(string3).capacity == (8)";
                pcVar7 = "(string3).capacity";
                iVar1 = 0x8fc;
                pcVar3 = (char *)string3.capacity;
LAB_0014a84a:
                local_100 = "(8)";
                local_f8 = (char *)0x8;
                goto LAB_0014a850;
              }
              uStack_f0 = 0x149db6;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8fc);
              if (string3.buffer == (char *)0x0) {
                ppcVar6 = &local_f8;
                pcVar4 = "Assertion \'_ck_x != NULL\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                pcVar7 = "(void*) (string3).buffer != NULL";
                pcVar8 = "(void*) (string3).buffer";
                iVar1 = 0x8fc;
                goto LAB_0014a970;
              }
              uStack_f0 = 0x149dd3;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8fc);
              pcVar8 = string3.buffer;
              if (string3.buffer == (char *)0x0) {
                pcVar8 = "(null)";
                pcVar3 = "";
              }
              else {
                uStack_f0 = 0x149df0;
                iVar1 = strcmp("b",string3.buffer);
                if (iVar1 == 0) {
                  uStack_f0 = 0x149e09;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8fc);
                  if (string3.size != 1) {
                    local_100 = "strlen(\"b\")";
                    pcVar4 = "(string3).size == strlen(\"b\")";
                    pcVar7 = "(string3).size";
                    iVar1 = 0x8fc;
                    pcVar3 = (char *)string3.size;
                    goto LAB_0014a813;
                  }
                  uStack_f0 = 0x149e29;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8fc);
                  if (string4.capacity == 8) {
                    uStack_f0 = 0x149e49;
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x8fd);
                    if (string4.buffer == (char *)0x0) {
                      ppcVar6 = &local_f8;
                      pcVar4 = "Assertion \'_ck_x != NULL\' failed";
                      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar7 = "(void*) (string4).buffer != NULL";
                      pcVar8 = "(void*) (string4).buffer";
                      iVar1 = 0x8fd;
                      goto LAB_0014a970;
                    }
                    uStack_f0 = 0x149e66;
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x8fd);
                    pcVar8 = string4.buffer;
                    if (string4.buffer == (char *)0x0) {
                      pcVar8 = "(null)";
                      pcVar3 = "";
                    }
                    else {
                      uStack_f0 = 0x149e83;
                      iVar1 = strcmp("ba",string4.buffer);
                      if (iVar1 == 0) {
                        uStack_f0 = 0x149e9c;
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x8fd);
                        if (string4.size == 2) {
                          uStack_f0 = 0x149ebc;
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8fd);
                          if (private_ACUtilsTest_AString_reallocCount == 0) {
                            uStack_f0 = 0x149edd;
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x8fe);
                            uStack_f0 = 0x149eec;
                            (*(code *)CONCAT44(string1.deallocator._4_4_,string1.deallocator._0_4_))
                                      (string1.buffer);
                            uStack_f0 = 0x149ef8;
                            (*(code *)CONCAT44(string2.deallocator._4_4_,string2.deallocator._0_4_))
                                      (string2.buffer);
                            uStack_f0 = 0x149f01;
                            (*(code *)CONCAT44(string3.deallocator._4_4_,string3.deallocator._0_4_))
                                      (string3.buffer);
                            uStack_f0 = 0x149f0a;
                            (*(code *)CONCAT44(string4.deallocator._4_4_,string4.deallocator._0_4_))
                                      (string4.buffer);
                            return;
                          }
                          ppcVar6 = &local_108;
                          local_100 = "(0)";
                          local_108 = (char *)private_ACUtilsTest_AString_reallocCount;
                          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
                          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                          pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
                          pcVar8 = "private_ACUtilsTest_AString_reallocCount";
                          iVar1 = 0x8fe;
                          goto LAB_0014a970;
                        }
                        iVar1 = 0x8fd;
                        goto LAB_0014a921;
                      }
                      pcVar3 = "\"";
                    }
                    expr = 
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ;
                    pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                    pcVar4 = "(string4).buffer == (\"ba\")";
                    pcVar7 = "(string4).buffer";
                    iVar1 = 0x8fd;
                    local_f8 = "\"";
                    local_100 = "ba";
                    local_108 = "\"";
                    pcStack_110 = "(\"ba\")";
                    ppcVar5 = &pcStack_120;
                    pcStack_120 = pcVar8;
                    pcStack_118 = pcVar3;
                    goto LAB_0014a852;
                  }
                  pcVar4 = "(string4).capacity == (8)";
                  pcVar7 = "(string4).capacity";
                  iVar1 = 0x8fd;
                  pcVar3 = (char *)string4.capacity;
                  goto LAB_0014a84a;
                }
                pcVar3 = "\"";
              }
              pcStack_110 = "(\"b\")";
              pcVar4 = "(string3).buffer == (\"b\")";
              pcVar7 = "(string3).buffer";
              iVar1 = 0x8fc;
              local_100 = "b";
            }
          }
        }
      }
      local_f8 = "\"";
      local_108 = "\"";
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      ppcVar5 = &pcStack_120;
      pcStack_120 = pcVar8;
      pcStack_118 = pcVar3;
      goto LAB_0014a852;
    }
    pcVar3 = "\"";
  }
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  pcVar4 = "(string2).buffer == (\"a\")";
  pcVar7 = "(string2).buffer";
  iVar1 = 0x8f1;
  local_f8 = "\"";
  local_100 = "a";
  local_108 = "\"";
  pcStack_110 = "(\"a\")";
  ppcVar5 = &pcStack_120;
  pcStack_120 = pcVar8;
  pcStack_118 = pcVar3;
LAB_0014a852:
  uStack_f0 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x14a859;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar2,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_compare_firstGreaterThanSecond)
{
    struct AString string1 = private_ACUtilsTest_AString_constructTestString("", 8);
    struct AString string2 = private_ACUtilsTest_AString_constructTestString("a", 8);
    struct AString string3 = private_ACUtilsTest_AString_constructTestString("b", 8);
    struct AString string4 = private_ACUtilsTest_AString_constructTestString("ba", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string2, &string1), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string1, "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string3, &string2), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string3, "b", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string4, &string2), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string4, "ba", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string4, &string3), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string3, "b", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string4, "ba", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string1);
    private_ACUtilsTest_AString_destructTestString(string2);
    private_ACUtilsTest_AString_destructTestString(string3);
    private_ACUtilsTest_AString_destructTestString(string4);
}